

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O0

void __thiscall
VmaBlockMetadata_Linear::PrintDetailedMap(VmaBlockMetadata_Linear *this,VmaJsonWriter *json)

{
  VmaBlockMetadata *pVVar1;
  VmaBlockMetadata *pVVar2;
  SuballocationVectorType *this_00;
  SuballocationVectorType *this_01;
  size_t sVar3;
  size_t sVar4;
  VmaSuballocation *pVVar5;
  VmaBlockMetadata_Linear *in_RDI;
  bool bVar6;
  VkDeviceSize unusedRangeSize_5;
  VkDeviceSize unusedRangeSize_4;
  VmaSuballocation *suballoc_5;
  size_t nextAlloc2ndIndex_3;
  VkDeviceSize unusedRangeSize_3;
  VkDeviceSize unusedRangeSize_2;
  VmaSuballocation *suballoc_4;
  VkDeviceSize unusedRangeSize_1;
  VkDeviceSize unusedRangeSize;
  VmaSuballocation *suballoc_3;
  size_t nextAlloc2ndIndex_2;
  VkDeviceSize freeSpace2ndTo1stEnd_1;
  VkDeviceSize unusedBytes;
  VmaSuballocation *suballoc_2;
  size_t nextAlloc2ndIndex_1;
  VmaSuballocation *suballoc_1;
  VkDeviceSize freeSpace1stTo2ndEnd;
  size_t alloc1stCount;
  size_t nextAlloc1stIndex;
  VmaSuballocation *suballoc;
  size_t nextAlloc2ndIndex;
  VkDeviceSize freeSpace2ndTo1stEnd;
  size_t alloc2ndCount;
  VkDeviceSize lastOffset;
  VkDeviceSize usedBytes;
  size_t unusedRangeCount;
  size_t suballoc2ndCount;
  size_t suballoc1stCount;
  SuballocationVectorType *suballocations2nd;
  SuballocationVectorType *suballocations1st;
  VkDeviceSize size;
  uint in_stack_fffffffffffffed8;
  undefined1 in_stack_fffffffffffffedc;
  undefined1 in_stack_fffffffffffffedd;
  undefined1 in_stack_fffffffffffffede;
  undefined1 in_stack_fffffffffffffedf;
  VmaBlockMetadata *pVVar7;
  VmaBlockMetadata *pVVar8;
  undefined7 in_stack_fffffffffffffee8;
  undefined1 in_stack_fffffffffffffeef;
  VmaJsonWriter *in_stack_fffffffffffffef8;
  VmaBlockMetadata *in_stack_ffffffffffffff00;
  size_t local_f0;
  ulong local_b8;
  size_t local_98;
  size_t local_78;
  ulong local_68;
  VmaBlockMetadata *local_50;
  
  pVVar2 = (VmaBlockMetadata *)VmaBlockMetadata::GetSize(&in_RDI->super_VmaBlockMetadata);
  this_00 = AccessSuballocations1st(in_RDI);
  this_01 = AccessSuballocations2nd(in_RDI);
  sVar3 = VmaVector<VmaSuballocation,_VmaStlAllocator<VmaSuballocation>_>::size(this_00);
  sVar4 = VmaVector<VmaSuballocation,_VmaStlAllocator<VmaSuballocation>_>::size(this_01);
  local_50 = (VmaBlockMetadata *)0x0;
  if (in_RDI->m_2ndVectorMode == SECOND_VECTOR_RING_BUFFER) {
    pVVar5 = VmaVector<VmaSuballocation,_VmaStlAllocator<VmaSuballocation>_>::operator[]
                       (this_00,in_RDI->m_1stNullItemsBeginCount);
    pVVar8 = (VmaBlockMetadata *)pVVar5->offset;
    local_68 = 0;
    while (local_50 < pVVar8) {
      while( true ) {
        in_stack_fffffffffffffeef = false;
        if (local_68 < sVar4) {
          pVVar5 = VmaVector<VmaSuballocation,_VmaStlAllocator<VmaSuballocation>_>::operator[]
                             (this_01,local_68);
          in_stack_fffffffffffffeef = pVVar5->userData == (void *)0x0;
        }
        if ((bool)in_stack_fffffffffffffeef == false) break;
        local_68 = local_68 + 1;
      }
      local_50 = pVVar8;
      if (local_68 < sVar4) {
        pVVar5 = VmaVector<VmaSuballocation,_VmaStlAllocator<VmaSuballocation>_>::operator[]
                           (this_01,local_68);
        local_68 = local_68 + 1;
        local_50 = (VmaBlockMetadata *)(pVVar5->offset + pVVar5->size);
      }
    }
  }
  local_78 = in_RDI->m_1stNullItemsBeginCount;
  pVVar8 = pVVar2;
  pVVar7 = pVVar2;
  if (in_RDI->m_2ndVectorMode == SECOND_VECTOR_DOUBLE_STACK) {
    pVVar5 = VmaVector<VmaSuballocation,_VmaStlAllocator<VmaSuballocation>_>::back(this_01);
    pVVar8 = (VmaBlockMetadata *)pVVar5->offset;
    pVVar7 = (VmaBlockMetadata *)pVVar5->offset;
  }
  while (local_50 < pVVar7) {
    while( true ) {
      in_stack_fffffffffffffedf = false;
      if (local_78 < sVar3) {
        pVVar5 = VmaVector<VmaSuballocation,_VmaStlAllocator<VmaSuballocation>_>::operator[]
                           (this_00,local_78);
        in_stack_fffffffffffffedf = pVVar5->userData == (void *)0x0;
      }
      if ((bool)in_stack_fffffffffffffedf == false) break;
      local_78 = local_78 + 1;
    }
    local_50 = pVVar7;
    if (local_78 < sVar3) {
      pVVar5 = VmaVector<VmaSuballocation,_VmaStlAllocator<VmaSuballocation>_>::operator[]
                         (this_00,local_78);
      local_78 = local_78 + 1;
      local_50 = (VmaBlockMetadata *)(pVVar5->offset + pVVar5->size);
    }
  }
  if (in_RDI->m_2ndVectorMode == SECOND_VECTOR_DOUBLE_STACK) {
    local_98 = VmaVector<VmaSuballocation,_VmaStlAllocator<VmaSuballocation>_>::size(this_01);
    local_98 = local_98 - 1;
    while (local_50 < pVVar2) {
      while( true ) {
        in_stack_fffffffffffffede = false;
        if (local_98 != 0xffffffffffffffff) {
          pVVar5 = VmaVector<VmaSuballocation,_VmaStlAllocator<VmaSuballocation>_>::operator[]
                             (this_01,local_98);
          in_stack_fffffffffffffede = pVVar5->userData == (void *)0x0;
        }
        if ((bool)in_stack_fffffffffffffede == false) break;
        local_98 = local_98 - 1;
      }
      local_50 = pVVar2;
      if (local_98 != 0xffffffffffffffff) {
        pVVar5 = VmaVector<VmaSuballocation,_VmaStlAllocator<VmaSuballocation>_>::operator[]
                           (this_01,local_98);
        local_98 = local_98 - 1;
        local_50 = (VmaBlockMetadata *)(pVVar5->offset + pVVar5->size);
      }
    }
  }
  VmaBlockMetadata::PrintDetailedMap_Begin
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,(VkDeviceSize)in_RDI,
             CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8),(size_t)pVVar8);
  local_50 = (VmaBlockMetadata *)0x0;
  if (in_RDI->m_2ndVectorMode == SECOND_VECTOR_RING_BUFFER) {
    pVVar5 = VmaVector<VmaSuballocation,_VmaStlAllocator<VmaSuballocation>_>::operator[]
                       (this_00,in_RDI->m_1stNullItemsBeginCount);
    pVVar1 = (VmaBlockMetadata *)pVVar5->offset;
    local_b8 = 0;
    while (local_50 < pVVar1) {
      while( true ) {
        in_stack_fffffffffffffedd = false;
        if (local_b8 < sVar4) {
          pVVar5 = VmaVector<VmaSuballocation,_VmaStlAllocator<VmaSuballocation>_>::operator[]
                             (this_01,local_b8);
          in_stack_fffffffffffffedd = pVVar5->userData == (void *)0x0;
        }
        if ((bool)in_stack_fffffffffffffedd == false) break;
        local_b8 = local_b8 + 1;
      }
      if (local_b8 < sVar4) {
        pVVar5 = VmaVector<VmaSuballocation,_VmaStlAllocator<VmaSuballocation>_>::operator[]
                           (this_01,local_b8);
        if (local_50 < (VmaBlockMetadata *)pVVar5->offset) {
          VmaBlockMetadata::PrintDetailedMap_UnusedRange
                    (&in_RDI->super_VmaBlockMetadata,
                     (VmaJsonWriter *)CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8),
                     (VkDeviceSize)pVVar8,
                     CONCAT17(in_stack_fffffffffffffedf,
                              CONCAT16(in_stack_fffffffffffffede,
                                       CONCAT15(in_stack_fffffffffffffedd,
                                                CONCAT14(in_stack_fffffffffffffedc,
                                                         in_stack_fffffffffffffed8)))));
        }
        VmaBlockMetadata::PrintDetailedMap_Allocation
                  (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,(VkDeviceSize)in_RDI,
                   CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8),pVVar8);
        local_b8 = local_b8 + 1;
        local_50 = (VmaBlockMetadata *)(pVVar5->offset + pVVar5->size);
      }
      else {
        bVar6 = local_50 < pVVar1;
        local_50 = pVVar1;
        if (bVar6) {
          VmaBlockMetadata::PrintDetailedMap_UnusedRange
                    (&in_RDI->super_VmaBlockMetadata,
                     (VmaJsonWriter *)CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8),
                     (VkDeviceSize)pVVar8,
                     CONCAT17(in_stack_fffffffffffffedf,
                              CONCAT16(in_stack_fffffffffffffede,
                                       (uint6)CONCAT14(in_stack_fffffffffffffedc,
                                                       in_stack_fffffffffffffed8))));
        }
      }
    }
  }
  local_78 = in_RDI->m_1stNullItemsBeginCount;
  while (local_50 < pVVar7) {
    while( true ) {
      in_stack_fffffffffffffedc = false;
      if (local_78 < sVar3) {
        pVVar5 = VmaVector<VmaSuballocation,_VmaStlAllocator<VmaSuballocation>_>::operator[]
                           (this_00,local_78);
        in_stack_fffffffffffffedc = pVVar5->userData == (void *)0x0;
      }
      if ((bool)in_stack_fffffffffffffedc == false) break;
      local_78 = local_78 + 1;
    }
    if (local_78 < sVar3) {
      pVVar5 = VmaVector<VmaSuballocation,_VmaStlAllocator<VmaSuballocation>_>::operator[]
                         (this_00,local_78);
      if (local_50 < (VmaBlockMetadata *)pVVar5->offset) {
        VmaBlockMetadata::PrintDetailedMap_UnusedRange
                  (&in_RDI->super_VmaBlockMetadata,
                   (VmaJsonWriter *)CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8),
                   (VkDeviceSize)pVVar8,
                   CONCAT17(in_stack_fffffffffffffedf,
                            CONCAT16(in_stack_fffffffffffffede,
                                     CONCAT15(in_stack_fffffffffffffedd,
                                              CONCAT14(in_stack_fffffffffffffedc,
                                                       in_stack_fffffffffffffed8)))));
      }
      VmaBlockMetadata::PrintDetailedMap_Allocation
                (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,(VkDeviceSize)in_RDI,
                 CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8),pVVar8);
      local_78 = local_78 + 1;
      local_50 = (VmaBlockMetadata *)(pVVar5->offset + pVVar5->size);
    }
    else {
      bVar6 = local_50 < pVVar7;
      local_50 = pVVar7;
      if (bVar6) {
        VmaBlockMetadata::PrintDetailedMap_UnusedRange
                  (&in_RDI->super_VmaBlockMetadata,
                   (VmaJsonWriter *)CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8),
                   (VkDeviceSize)pVVar8,
                   CONCAT17(in_stack_fffffffffffffedf,
                            CONCAT16(in_stack_fffffffffffffede,
                                     CONCAT15(in_stack_fffffffffffffedd,
                                              (uint5)in_stack_fffffffffffffed8))));
      }
    }
  }
  if (in_RDI->m_2ndVectorMode == SECOND_VECTOR_DOUBLE_STACK) {
    local_f0 = VmaVector<VmaSuballocation,_VmaStlAllocator<VmaSuballocation>_>::size(this_01);
    local_f0 = local_f0 - 1;
    pVVar7 = local_50;
    while (local_50 = pVVar7, local_50 < pVVar2) {
      while( true ) {
        in_stack_fffffffffffffed8 = in_stack_fffffffffffffed8 & 0xffffff;
        if (local_f0 != 0xffffffffffffffff) {
          pVVar5 = VmaVector<VmaSuballocation,_VmaStlAllocator<VmaSuballocation>_>::operator[]
                             (this_01,local_f0);
          in_stack_fffffffffffffed8 =
               CONCAT13(pVVar5->userData == (void *)0x0,(int3)in_stack_fffffffffffffed8);
        }
        if ((char)(in_stack_fffffffffffffed8 >> 0x18) == '\0') break;
        local_f0 = local_f0 - 1;
      }
      if (local_f0 == 0xffffffffffffffff) {
        pVVar7 = pVVar2;
        if (local_50 < pVVar2) {
          in_stack_fffffffffffffef8 = (VmaJsonWriter *)((long)pVVar2 - (long)local_50);
          VmaBlockMetadata::PrintDetailedMap_UnusedRange
                    (&in_RDI->super_VmaBlockMetadata,
                     (VmaJsonWriter *)CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8),
                     (VkDeviceSize)pVVar8,
                     CONCAT17(in_stack_fffffffffffffedf,
                              CONCAT16(in_stack_fffffffffffffede,
                                       CONCAT15(in_stack_fffffffffffffedd,
                                                CONCAT14(in_stack_fffffffffffffedc,
                                                         in_stack_fffffffffffffed8)))));
        }
      }
      else {
        pVVar5 = VmaVector<VmaSuballocation,_VmaStlAllocator<VmaSuballocation>_>::operator[]
                           (this_01,local_f0);
        if (local_50 < (VmaBlockMetadata *)pVVar5->offset) {
          in_stack_ffffffffffffff00 = (VmaBlockMetadata *)(pVVar5->offset - (long)local_50);
          VmaBlockMetadata::PrintDetailedMap_UnusedRange
                    (&in_RDI->super_VmaBlockMetadata,
                     (VmaJsonWriter *)CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8),
                     (VkDeviceSize)pVVar8,
                     CONCAT17(in_stack_fffffffffffffedf,
                              CONCAT16(in_stack_fffffffffffffede,
                                       CONCAT15(in_stack_fffffffffffffedd,
                                                CONCAT14(in_stack_fffffffffffffedc,
                                                         in_stack_fffffffffffffed8)))));
        }
        VmaBlockMetadata::PrintDetailedMap_Allocation
                  (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,(VkDeviceSize)in_RDI,
                   CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8),pVVar8);
        local_f0 = local_f0 - 1;
        pVVar7 = (VmaBlockMetadata *)(pVVar5->offset + pVVar5->size);
      }
    }
  }
  VmaBlockMetadata::PrintDetailedMap_End
            (pVVar8,(VmaJsonWriter *)
                    CONCAT17(in_stack_fffffffffffffedf,
                             CONCAT16(in_stack_fffffffffffffede,
                                      CONCAT15(in_stack_fffffffffffffedd,
                                               CONCAT14(in_stack_fffffffffffffedc,
                                                        in_stack_fffffffffffffed8)))));
  return;
}

Assistant:

void VmaBlockMetadata_Linear::PrintDetailedMap(class VmaJsonWriter& json) const
{
    const VkDeviceSize size = GetSize();
    const SuballocationVectorType& suballocations1st = AccessSuballocations1st();
    const SuballocationVectorType& suballocations2nd = AccessSuballocations2nd();
    const size_t suballoc1stCount = suballocations1st.size();
    const size_t suballoc2ndCount = suballocations2nd.size();

    // FIRST PASS

    size_t unusedRangeCount = 0;
    VkDeviceSize usedBytes = 0;

    VkDeviceSize lastOffset = 0;

    size_t alloc2ndCount = 0;
    if (m_2ndVectorMode == SECOND_VECTOR_RING_BUFFER)
    {
        const VkDeviceSize freeSpace2ndTo1stEnd = suballocations1st[m_1stNullItemsBeginCount].offset;
        size_t nextAlloc2ndIndex = 0;
        while (lastOffset < freeSpace2ndTo1stEnd)
        {
            // Find next non-null allocation or move nextAlloc2ndIndex to the end.
            while (nextAlloc2ndIndex < suballoc2ndCount &&
                suballocations2nd[nextAlloc2ndIndex].userData == VMA_NULL)
            {
                ++nextAlloc2ndIndex;
            }

            // Found non-null allocation.
            if (nextAlloc2ndIndex < suballoc2ndCount)
            {
                const VmaSuballocation& suballoc = suballocations2nd[nextAlloc2ndIndex];

                // 1. Process free space before this allocation.
                if (lastOffset < suballoc.offset)
                {
                    // There is free space from lastOffset to suballoc.offset.
                    ++unusedRangeCount;
                }

                // 2. Process this allocation.
                // There is allocation with suballoc.offset, suballoc.size.
                ++alloc2ndCount;
                usedBytes += suballoc.size;

                // 3. Prepare for next iteration.
                lastOffset = suballoc.offset + suballoc.size;
                ++nextAlloc2ndIndex;
            }
            // We are at the end.
            else
            {
                if (lastOffset < freeSpace2ndTo1stEnd)
                {
                    // There is free space from lastOffset to freeSpace2ndTo1stEnd.
                    ++unusedRangeCount;
                }

                // End of loop.
                lastOffset = freeSpace2ndTo1stEnd;
            }
        }
    }

    size_t nextAlloc1stIndex = m_1stNullItemsBeginCount;
    size_t alloc1stCount = 0;
    const VkDeviceSize freeSpace1stTo2ndEnd =
        m_2ndVectorMode == SECOND_VECTOR_DOUBLE_STACK ? suballocations2nd.back().offset : size;
    while (lastOffset < freeSpace1stTo2ndEnd)
    {
        // Find next non-null allocation or move nextAllocIndex to the end.
        while (nextAlloc1stIndex < suballoc1stCount &&
            suballocations1st[nextAlloc1stIndex].userData == VMA_NULL)
        {
            ++nextAlloc1stIndex;
        }

        // Found non-null allocation.
        if (nextAlloc1stIndex < suballoc1stCount)
        {
            const VmaSuballocation& suballoc = suballocations1st[nextAlloc1stIndex];

            // 1. Process free space before this allocation.
            if (lastOffset < suballoc.offset)
            {
                // There is free space from lastOffset to suballoc.offset.
                ++unusedRangeCount;
            }

            // 2. Process this allocation.
            // There is allocation with suballoc.offset, suballoc.size.
            ++alloc1stCount;
            usedBytes += suballoc.size;

            // 3. Prepare for next iteration.
            lastOffset = suballoc.offset + suballoc.size;
            ++nextAlloc1stIndex;
        }
        // We are at the end.
        else
        {
            if (lastOffset < size)
            {
                // There is free space from lastOffset to freeSpace1stTo2ndEnd.
                ++unusedRangeCount;
            }

            // End of loop.
            lastOffset = freeSpace1stTo2ndEnd;
        }
    }

    if (m_2ndVectorMode == SECOND_VECTOR_DOUBLE_STACK)
    {
        size_t nextAlloc2ndIndex = suballocations2nd.size() - 1;
        while (lastOffset < size)
        {
            // Find next non-null allocation or move nextAlloc2ndIndex to the end.
            while (nextAlloc2ndIndex != SIZE_MAX &&
                suballocations2nd[nextAlloc2ndIndex].userData == VMA_NULL)
            {
                --nextAlloc2ndIndex;
            }

            // Found non-null allocation.
            if (nextAlloc2ndIndex != SIZE_MAX)
            {
                const VmaSuballocation& suballoc = suballocations2nd[nextAlloc2ndIndex];

                // 1. Process free space before this allocation.
                if (lastOffset < suballoc.offset)
                {
                    // There is free space from lastOffset to suballoc.offset.
                    ++unusedRangeCount;
                }

                // 2. Process this allocation.
                // There is allocation with suballoc.offset, suballoc.size.
                ++alloc2ndCount;
                usedBytes += suballoc.size;

                // 3. Prepare for next iteration.
                lastOffset = suballoc.offset + suballoc.size;
                --nextAlloc2ndIndex;
            }
            // We are at the end.
            else
            {
                if (lastOffset < size)
                {
                    // There is free space from lastOffset to size.
                    ++unusedRangeCount;
                }

                // End of loop.
                lastOffset = size;
            }
        }
    }

    const VkDeviceSize unusedBytes = size - usedBytes;
    PrintDetailedMap_Begin(json, unusedBytes, alloc1stCount + alloc2ndCount, unusedRangeCount);

    // SECOND PASS
    lastOffset = 0;

    if (m_2ndVectorMode == SECOND_VECTOR_RING_BUFFER)
    {
        const VkDeviceSize freeSpace2ndTo1stEnd = suballocations1st[m_1stNullItemsBeginCount].offset;
        size_t nextAlloc2ndIndex = 0;
        while (lastOffset < freeSpace2ndTo1stEnd)
        {
            // Find next non-null allocation or move nextAlloc2ndIndex to the end.
            while (nextAlloc2ndIndex < suballoc2ndCount &&
                suballocations2nd[nextAlloc2ndIndex].userData == VMA_NULL)
            {
                ++nextAlloc2ndIndex;
            }

            // Found non-null allocation.
            if (nextAlloc2ndIndex < suballoc2ndCount)
            {
                const VmaSuballocation& suballoc = suballocations2nd[nextAlloc2ndIndex];

                // 1. Process free space before this allocation.
                if (lastOffset < suballoc.offset)
                {
                    // There is free space from lastOffset to suballoc.offset.
                    const VkDeviceSize unusedRangeSize = suballoc.offset - lastOffset;
                    PrintDetailedMap_UnusedRange(json, lastOffset, unusedRangeSize);
                }

                // 2. Process this allocation.
                // There is allocation with suballoc.offset, suballoc.size.
                PrintDetailedMap_Allocation(json, suballoc.offset, suballoc.size, suballoc.userData);

                // 3. Prepare for next iteration.
                lastOffset = suballoc.offset + suballoc.size;
                ++nextAlloc2ndIndex;
            }
            // We are at the end.
            else
            {
                if (lastOffset < freeSpace2ndTo1stEnd)
                {
                    // There is free space from lastOffset to freeSpace2ndTo1stEnd.
                    const VkDeviceSize unusedRangeSize = freeSpace2ndTo1stEnd - lastOffset;
                    PrintDetailedMap_UnusedRange(json, lastOffset, unusedRangeSize);
                }

                // End of loop.
                lastOffset = freeSpace2ndTo1stEnd;
            }
        }
    }

    nextAlloc1stIndex = m_1stNullItemsBeginCount;
    while (lastOffset < freeSpace1stTo2ndEnd)
    {
        // Find next non-null allocation or move nextAllocIndex to the end.
        while (nextAlloc1stIndex < suballoc1stCount &&
            suballocations1st[nextAlloc1stIndex].userData == VMA_NULL)
        {
            ++nextAlloc1stIndex;
        }

        // Found non-null allocation.
        if (nextAlloc1stIndex < suballoc1stCount)
        {
            const VmaSuballocation& suballoc = suballocations1st[nextAlloc1stIndex];

            // 1. Process free space before this allocation.
            if (lastOffset < suballoc.offset)
            {
                // There is free space from lastOffset to suballoc.offset.
                const VkDeviceSize unusedRangeSize = suballoc.offset - lastOffset;
                PrintDetailedMap_UnusedRange(json, lastOffset, unusedRangeSize);
            }

            // 2. Process this allocation.
            // There is allocation with suballoc.offset, suballoc.size.
            PrintDetailedMap_Allocation(json, suballoc.offset, suballoc.size, suballoc.userData);

            // 3. Prepare for next iteration.
            lastOffset = suballoc.offset + suballoc.size;
            ++nextAlloc1stIndex;
        }
        // We are at the end.
        else
        {
            if (lastOffset < freeSpace1stTo2ndEnd)
            {
                // There is free space from lastOffset to freeSpace1stTo2ndEnd.
                const VkDeviceSize unusedRangeSize = freeSpace1stTo2ndEnd - lastOffset;
                PrintDetailedMap_UnusedRange(json, lastOffset, unusedRangeSize);
            }

            // End of loop.
            lastOffset = freeSpace1stTo2ndEnd;
        }
    }

    if (m_2ndVectorMode == SECOND_VECTOR_DOUBLE_STACK)
    {
        size_t nextAlloc2ndIndex = suballocations2nd.size() - 1;
        while (lastOffset < size)
        {
            // Find next non-null allocation or move nextAlloc2ndIndex to the end.
            while (nextAlloc2ndIndex != SIZE_MAX &&
                suballocations2nd[nextAlloc2ndIndex].userData == VMA_NULL)
            {
                --nextAlloc2ndIndex;
            }

            // Found non-null allocation.
            if (nextAlloc2ndIndex != SIZE_MAX)
            {
                const VmaSuballocation& suballoc = suballocations2nd[nextAlloc2ndIndex];

                // 1. Process free space before this allocation.
                if (lastOffset < suballoc.offset)
                {
                    // There is free space from lastOffset to suballoc.offset.
                    const VkDeviceSize unusedRangeSize = suballoc.offset - lastOffset;
                    PrintDetailedMap_UnusedRange(json, lastOffset, unusedRangeSize);
                }

                // 2. Process this allocation.
                // There is allocation with suballoc.offset, suballoc.size.
                PrintDetailedMap_Allocation(json, suballoc.offset, suballoc.size, suballoc.userData);

                // 3. Prepare for next iteration.
                lastOffset = suballoc.offset + suballoc.size;
                --nextAlloc2ndIndex;
            }
            // We are at the end.
            else
            {
                if (lastOffset < size)
                {
                    // There is free space from lastOffset to size.
                    const VkDeviceSize unusedRangeSize = size - lastOffset;
                    PrintDetailedMap_UnusedRange(json, lastOffset, unusedRangeSize);
                }

                // End of loop.
                lastOffset = size;
            }
        }
    }

    PrintDetailedMap_End(json);
}